

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

void __thiscall Catch::anon_unknown_1::TestGroup::~TestGroup(TestGroup *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector(&this->m_matches);
  clara::std::
  _Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
  ::~_Rb_tree(&(this->m_tests)._M_t);
  RunContext::~RunContext(&this->m_context);
  this_00 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

explicit TestGroup(std::shared_ptr<Config> const& config)
            : m_config{config}
            , m_context{config, makeReporter(config)}
            {
                auto const& allTestCases = getAllTestCasesSorted(*m_config);
                m_matches = m_config->testSpec().matchesByFilter(allTestCases, *m_config);
                auto const& invalidArgs = m_config->testSpec().getInvalidArgs();

                if (m_matches.empty() && invalidArgs.empty()) {
                    for (auto const& test : allTestCases)
                        if (!test.isHidden())
                            m_tests.emplace(&test);
                } else {
                    for (auto const& match : m_matches)
                        m_tests.insert(match.tests.begin(), match.tests.end());
                }
            }